

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_verify
              (secp256k1_context *ctx,uchar *adaptor_sig162,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *enckey)

{
  int iVar1;
  secp256k1_scalar *rzr;
  void *pvVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge pubkey_ge;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar e_neg;
  secp256k1_ge rp;
  secp256k1_scalar msg;
  secp256k1_scalar e_expected;
  secp256k1_gej derived_rp;
  secp256k1_scalar u1;
  secp256k1_ge enckey_ge;
  secp256k1_ge r;
  secp256k1_scalar u2;
  secp256k1_gej pubkeyj;
  secp256k1_scalar sn;
  secp256k1_ge r2;
  
  if (adaptor_sig162 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_sig162 != NULL";
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  else if (msg32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msg32 != NULL";
  }
  else {
    if (enckey != (secp256k1_pubkey *)0x0) {
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        (&r,&sigr,&rp,&sp,&dleq_proof_e,&dleq_proof_s,adaptor_sig162);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&enckey_ge,enckey);
      if (iVar1 == 0) {
        return 0;
      }
      pubkeyj.infinity = rp.infinity;
      pubkeyj.x.n[0] = rp.x.n[0];
      pubkeyj.x.n[1] = rp.x.n[1];
      pubkeyj.x.n[2] = rp.x.n[2];
      pubkeyj.x.n[3] = rp.x.n[3];
      pubkeyj.x.n[4] = rp.x.n[4];
      pubkeyj.y.n[0] = rp.y.n[0];
      pubkeyj.y.n[1] = rp.y.n[1];
      pubkeyj.y.n[2] = rp.y.n[2];
      pubkeyj.y.n[3] = rp.y.n[3];
      pubkeyj.y.n[4] = rp.y.n[4];
      pubkeyj.z.n[0] = 1;
      pubkeyj.z.n._24_16_ = ZEXT816(0);
      pubkeyj.z.n._8_16_ = ZEXT816(0);
      pubkey_ge.x.n[4] = r.x.n[4];
      pubkey_ge.x.n[2] = r.x.n[2];
      pubkey_ge.x.n[3] = r.x.n[3];
      pubkey_ge.x.n[0] = r.x.n[0];
      pubkey_ge.x.n[1] = r.x.n[1];
      pubkey_ge.y.n[4] = r.y.n[4];
      pubkey_ge.y.n[2] = r.y.n[2];
      pubkey_ge.y.n[3] = r.y.n[3];
      pubkey_ge.y.n[0] = r.y.n[0];
      pubkey_ge.y.n[1] = r.y.n[1];
      pubkey_ge.infinity = 1;
      pubkey_ge._84_4_ = 0;
      secp256k1_scalar_negate(&e_neg,&dleq_proof_e);
      secp256k1_ecmult((secp256k1_gej *)&msg,&pubkeyj,&e_neg,&dleq_proof_s);
      secp256k1_ecmult((secp256k1_gej *)&u1,(secp256k1_gej *)&pubkey_ge,&e_neg,
                       &secp256k1_scalar_zero);
      derived_rp.infinity = enckey_ge.infinity;
      derived_rp.x.n[0] = enckey_ge.x.n[0];
      derived_rp.x.n[1] = enckey_ge.x.n[1];
      derived_rp.x.n[2] = enckey_ge.x.n[2];
      derived_rp.x.n[3] = enckey_ge.x.n[3];
      derived_rp.x.n[4] = enckey_ge.x.n[4];
      derived_rp.y.n[0] = enckey_ge.y.n[0];
      derived_rp.y.n[1] = enckey_ge.y.n[1];
      derived_rp.y.n[2] = enckey_ge.y.n[2];
      derived_rp.y.n[3] = enckey_ge.y.n[3];
      derived_rp.y.n[4] = enckey_ge.y.n[4];
      derived_rp.z.n[0] = 1;
      derived_rp.z.n[1] = 0;
      derived_rp.z.n[2] = 0;
      derived_rp.z.n[3] = 0;
      derived_rp.z.n[4] = 0;
      rzr = &secp256k1_scalar_zero;
      secp256k1_ecmult((secp256k1_gej *)&sn,&derived_rp,&dleq_proof_s,&secp256k1_scalar_zero);
      secp256k1_gej_add_var
                ((secp256k1_gej *)&sn,(secp256k1_gej *)&sn,(secp256k1_gej *)&u1,(secp256k1_fe *)rzr)
      ;
      secp256k1_ge_set_gej((secp256k1_ge *)&u2,(secp256k1_gej *)&msg);
      secp256k1_ge_set_gej(&r2,(secp256k1_gej *)&sn);
      secp256k1_dleq_challenge(&e_expected,&enckey_ge,(secp256k1_ge *)&u2,&r2,&rp,&r);
      iVar1 = secp256k1_scalar_add(&e_expected,&e_expected,&e_neg);
      auVar4._0_4_ = -(uint)((int)e_expected.d[2] == 0 && (int)e_expected.d[0] == 0);
      auVar4._4_4_ = -(uint)(e_expected.d[2]._4_4_ == 0 && e_expected.d[0]._4_4_ == 0);
      auVar4._8_4_ = -(uint)((int)e_expected.d[3] == 0 && (int)e_expected.d[1] == 0);
      auVar4._12_4_ = -(uint)(e_expected.d[3]._4_4_ == 0 && e_expected.d[1]._4_4_ == 0);
      iVar1 = movmskps(iVar1,auVar4);
      if (iVar1 != 0xf) {
        return 0;
      }
      secp256k1_scalar_set_b32(&msg,msg32,(int *)0x0);
      iVar1 = secp256k1_pubkey_load(ctx,&pubkey_ge,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_inverse_var(&sn,&sp);
      secp256k1_scalar_mul(&u1,&sn,&msg);
      secp256k1_scalar_mul(&u2,&sn,&sigr);
      pubkeyj.infinity = pubkey_ge.infinity;
      pubkeyj.x.n[0] = pubkey_ge.x.n[0];
      pubkeyj.x.n[1] = pubkey_ge.x.n[1];
      pubkeyj.x.n[2] = pubkey_ge.x.n[2];
      pubkeyj.x.n[3] = pubkey_ge.x.n[3];
      pubkeyj.x.n[4] = pubkey_ge.x.n[4];
      pubkeyj.y.n[0] = pubkey_ge.y.n[0];
      pubkeyj.y.n[1] = pubkey_ge.y.n[1];
      pubkeyj.y.n[2] = pubkey_ge.y.n[2];
      pubkeyj.y.n[3] = pubkey_ge.y.n[3];
      pubkeyj.y.n[4] = pubkey_ge.y.n[4];
      pubkeyj.z.n[0] = 1;
      pubkeyj.z.n[1] = 0;
      pubkeyj.z.n[2] = 0;
      pubkeyj.z.n[3] = 0;
      pubkeyj.z.n[4] = 0;
      secp256k1_ecmult(&derived_rp,&pubkeyj,&u2,&u1);
      if (derived_rp.infinity != 0) {
        return 0;
      }
      secp256k1_gej_neg(&derived_rp,&derived_rp);
      secp256k1_gej_add_ge_var(&derived_rp,&derived_rp,&rp,(secp256k1_fe *)0x0);
      return derived_rp.infinity;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "enckey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig162, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *enckey) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge pubkey_ge;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge enckey_ge;
    secp256k1_gej derived_rp;
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &rp, &sp, &dleq_proof_e, &dleq_proof_s, adaptor_sig162)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &enckey_ge, enckey)) {
        return 0;
    }
    /* DLEQ_verify((R', Y, R), dleq_proof) */
    if(!secp256k1_dleq_verify(&dleq_proof_s, &dleq_proof_e, &rp, &enckey_ge, &r)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    /* return R' == s'⁻¹(m * G + R.x * X) */
    secp256k1_scalar_inverse_var(&sn, &sp);
    secp256k1_scalar_mul(&u1, &sn, &msg);
    secp256k1_scalar_mul(&u2, &sn, &sigr);
    secp256k1_gej_set_ge(&pubkeyj, &pubkey_ge);
    secp256k1_ecmult(&derived_rp, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&derived_rp)) {
        return 0;
    }
    secp256k1_gej_neg(&derived_rp, &derived_rp);
    secp256k1_gej_add_ge_var(&derived_rp, &derived_rp, &rp, NULL);
    return secp256k1_gej_is_infinity(&derived_rp);
}